

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZEqnArray<long_double>,_10>::~TPZManVector
          (TPZManVector<TPZEqnArray<long_double>,_10> *this)

{
  ~TPZManVector(this);
  operator_delete(this,0x332e0);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}